

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

GCproto * fs_finish(LexState *ls,BCLine line)

{
  MSize sz;
  uint8_t *puVar1;
  SBuf *sb;
  uint *puVar2;
  uint uVar3;
  BCPos BVar4;
  FuncState *fs;
  lua_State *L;
  VarInfo *pVVar5;
  uint64_t uVar6;
  char *pcVar7;
  GCtab *pGVar8;
  TValue *pTVar9;
  uint uVar10;
  BCPos BVar11;
  long lVar12;
  GCobj *o;
  ptrdiff_t argbase;
  byte bVar13;
  byte bVar14;
  BCInsLine *pBVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  char *pcVar21;
  VarInfo *pVVar22;
  uint uVar23;
  ushort uVar24;
  ulong uVar25;
  ulong uVar26;
  TValue *pTVar27;
  void *__dest;
  GCobj *v;
  uint uVar28;
  char *pcVar29;
  long lVar30;
  long lVar31;
  char *__dest_00;
  
  fs = ls->fs;
  uVar23 = line - fs->linedefined;
  L = ls->L;
  uVar3 = fs->pc;
  if (((uVar3 <= fs->lasttarget) || (uVar10 = (byte)fs->bcbase[uVar3 - 1].ins - 0x43, 9 < uVar10))
     || ((0x3c3U >> (uVar10 & 0x1f) & 1) == 0)) {
    if ((fs->bl->flags & 8) != 0) {
      bcemit_INS(fs,0x80000032);
    }
    bcemit_INS(fs,0x1004b);
  }
  puVar1 = &fs->bl->flags;
  *puVar1 = *puVar1 | 0x10;
  fscope_end(fs);
  if ((1 < uVar3) && ((fs->flags & 0x40) != 0)) {
    pBVar15 = fs->bcbase;
    iVar19 = 0x7ffe;
    lVar31 = 0;
    do {
      uVar10 = (pBVar15[lVar31 + 1].ins & 0xff) - 0x32;
      if (uVar10 < 0x1b) {
        if ((0x7860000U >> (uVar10 & 0x1f) & 1) == 0) {
          if (uVar10 == 0) break;
        }
        else {
          BVar11 = bcemit_INS(fs,pBVar15[lVar31 + 1].ins);
          pBVar15 = fs->bcbase;
          pBVar15[BVar11].line = pBVar15[lVar31 + 1].line;
          if (0xffff < BVar11 + iVar19) {
            err_syntax(fs->ls,LJ_ERR_XFIXUP);
          }
          pBVar15[lVar31 + 1].ins = (BVar11 + iVar19) * 0x10000 | 0x32;
        }
      }
      lVar31 = lVar31 + 1;
      iVar19 = iVar19 + -1;
    } while ((ulong)uVar3 - 1 != lVar31);
  }
  uVar3 = fs->pc;
  uVar10 = fs->nkn;
  uVar25 = (ulong)fs->nkgc * 8 + (ulong)uVar3 * 4 + 0x6f & 0xffffffff8;
  bVar14 = fs->nuv;
  uVar16 = (ulong)((uint)bVar14 * 2 + 2 & 0xfffffffc);
  bVar13 = 2 - (uVar23 < 0x10000);
  lVar31 = uVar25 + (ulong)uVar10 * 8;
  if ((int)uVar23 < 0x100) {
    bVar13 = 0;
  }
  sb = &ls->sb;
  pcVar21 = (ls->sb).b;
  pVVar5 = ls->vstack;
  (ls->sb).w = pcVar21;
  __dest_00 = pcVar21;
  if (bVar14 != 0) {
    uVar20 = 0;
    do {
      uVar6 = pVVar5[fs->uvmap[uVar20]].name.gcptr64;
      uVar28 = *(int *)(uVar6 + 0x14) + 1;
      if ((uint)(*(int *)&(ls->sb).e - (int)__dest_00) < uVar28) {
        __dest_00 = lj_buf_more2(sb,uVar28);
      }
      memcpy(__dest_00,(void *)(uVar6 + 0x18),(ulong)uVar28);
      __dest_00 = __dest_00 + uVar28;
      sb->w = __dest_00;
      uVar20 = uVar20 + 1;
    } while (bVar14 != uVar20);
    pcVar21 = (ls->sb).b;
  }
  lVar12 = uVar16 + lVar31;
  uVar28 = ls->vtop;
  pcVar29 = __dest_00;
  if (fs->vbase < uVar28) {
    pVVar22 = pVVar5 + fs->vbase;
    BVar11 = 0;
    do {
      if ((pVVar22->info & 6) == 0) {
        uVar20 = (pVVar22->name).gcptr64;
        if (uVar20 < 7) {
          if ((uint)(*(int *)&(ls->sb).e - (int)pcVar29) < 0xb) {
            pcVar29 = lj_buf_more2(sb,0xb);
          }
          *pcVar29 = (char)uVar20;
          pcVar29 = pcVar29 + 1;
        }
        else {
          iVar19 = *(int *)(uVar20 + 0x14);
          sz = iVar19 + 0xb;
          if ((uint)(*(int *)&(ls->sb).e - (int)pcVar29) < sz) {
            pcVar29 = lj_buf_more2(sb,sz);
          }
          uVar18 = (ulong)(iVar19 + 1);
          memcpy(pcVar29,(void *)(uVar20 + 0x18),uVar18);
          pcVar29 = pcVar29 + uVar18;
        }
        BVar4 = pVVar22->startpc;
        pcVar29 = lj_strfmt_wuleb128(pcVar29,BVar4 - BVar11);
        pcVar29 = lj_strfmt_wuleb128(pcVar29,pVVar22->endpc - BVar4);
        sb->w = pcVar29;
        BVar11 = BVar4;
      }
      pVVar22 = pVVar22 + 1;
    } while (pVVar22 < pVVar5 + uVar28);
  }
  lVar30 = (ulong)(uVar3 - 1 << (bVar13 & 0x1f)) + lVar12;
  if (*(int *)&(ls->sb).e == (int)pcVar29) {
    pcVar29 = lj_buf_more2(sb,1);
  }
  *pcVar29 = '\0';
  pcVar29 = pcVar29 + 1;
  (ls->sb).w = pcVar29;
  pcVar7 = (ls->sb).b;
  o = (GCobj *)lj_mem_newgco(L,(ulong)(pcVar29 + (lVar30 - (long)pcVar7)) & 0xffffffff);
  (o->gch).gct = '\a';
  (o->pt).sizept = (MSize)(pcVar29 + (lVar30 - (long)pcVar7));
  (o->pt).trace = 0;
  bVar14 = fs->flags;
  (o->pt).flags = bVar14 & 0x9f;
  (o->gch).unused1 = fs->numparams;
  bVar13 = fs->framesize;
  (o->gch).unused2 = bVar13;
  (o->th).openupval.gcptr64 = (uint64_t)ls->chunkname;
  pTVar27 = (TValue *)((long)o + uVar25);
  pTVar27[-(ulong)(fs->nkgc + 1)].field_4.i = 0;
  uVar3 = fs->pc;
  bVar14 = (bVar14 & 2) >> 1;
  pBVar15 = fs->bcbase;
  (o->str).sid = uVar3;
  *(uint *)&(o->th).exdata2 = (uint)bVar14 + (uint)bVar14 * 2 + (uint)bVar13 * 0x100 + 0x59;
  if (1 < (ulong)uVar3) {
    lVar17 = 0;
    do {
      *(BCIns *)((long)o + lVar17 * 4 + 0x6c) = pBVar15[lVar17 + 1].ins;
      lVar17 = lVar17 + 1;
    } while ((ulong)uVar3 - 1 != lVar17);
  }
  uVar3 = fs->nkn;
  if ((uVar3 < 0x10001) && (uVar28 = fs->nkgc, uVar28 < 0x10001)) {
    (o->th).base = pTVar27;
    (o->pt).sizekn = uVar3;
    (o->pt).sizekgc = uVar28;
    pGVar8 = fs->kt;
    uVar20 = (ulong)pGVar8->asize;
    if (pGVar8->asize != 0) {
      uVar6 = (pGVar8->array).ptr64;
      uVar18 = 0;
      do {
        if (*(int *)(uVar6 + 4 + uVar18 * 8) == 0) {
          pTVar27[*(uint *)(uVar6 + uVar18 * 8)].n = (double)(uVar18 & 0xffffffff);
          uVar20 = (ulong)pGVar8->asize;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar20);
    }
    lVar17 = (ulong)uVar10 * 8;
    uVar6 = (pGVar8->node).ptr64;
    uVar3 = pGVar8->hmask;
    uVar20 = 0;
    do {
      if (*(int *)(uVar6 + 4 + uVar20 * 0x18) == 0) {
        puVar2 = (uint *)(uVar6 + uVar20 * 0x18);
        uVar18 = *(ulong *)(puVar2 + 2);
        if ((ushort)(uVar18 >> 0x30) < 0xfff9) {
          pTVar27[*puVar2].u64 = uVar18;
        }
        else {
          v = (GCobj *)(uVar18 & 0x7fffffffffff);
          pTVar27[~(ulong)*puVar2].u64 = (uint64_t)v;
          if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
            lj_gc_barrierf((global_State *)(fs->L->glref).ptr64,o,v);
          }
          if (((*(ulong *)(puVar2 + 2) & 0xffff800000000000) == 0xfffc000000000000) &&
             (bVar14 = (v->pt).sizeuv, (ulong)bVar14 != 0)) {
            pTVar9 = (v->th).top;
            pVVar5 = fs->ls->vstack;
            uVar18 = 0;
            do {
              uVar24 = *(ushort *)((long)pTVar9 + uVar18 * 2);
              uVar26 = (ulong)uVar24;
              if (uVar26 < 0xff88) {
                uVar24 = (ushort)pVVar5[uVar26].slot;
                if ((pVVar5[uVar26].info & 1) == 0) {
                  uVar24 = uVar24 | 0xc000;
                }
                else {
                  uVar24 = uVar24 | 0x8000;
                }
              }
              else {
                uVar24 = uVar24 + 0x78;
              }
              *(ushort *)((long)pTVar9 + uVar18 * 2) = uVar24;
              uVar18 = uVar18 + 1;
            } while (bVar14 != uVar18);
          }
        }
      }
      uVar10 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar10;
    } while (uVar10 <= uVar3);
    pTVar27 = (TValue *)(lVar31 + (long)o);
    (o->th).top = pTVar27;
    bVar14 = fs->nuv;
    (o->pt).sizeuv = bVar14;
    memcpy(pTVar27,fs->uvtmp,(ulong)((uint)bVar14 * 2));
    iVar19 = fs->linedefined;
    uVar20 = (ulong)((fs->pc - 1) + (uint)(fs->pc == 1));
    pBVar15 = fs->bcbase;
    (o->pt).firstline = iVar19;
    (o->pt).numline = uVar23;
    (o->th).cframe = (void *)(lVar12 + (long)o);
    if ((int)uVar23 < 0x100) {
      uVar18 = 0;
      do {
        *(char *)((long)o + uVar18 + uVar25 + lVar17 + uVar16) =
             (char)pBVar15[uVar18 + 1].line - (char)iVar19;
        uVar18 = uVar18 + 1;
      } while (uVar20 != uVar18);
    }
    else if (uVar23 < 0x10000) {
      uVar18 = 0;
      do {
        *(short *)((long)o + uVar18 * 2 + uVar25 + lVar17 + uVar16) =
             (short)pBVar15[uVar18 + 1].line - (short)iVar19;
        uVar18 = uVar18 + 1;
      } while (uVar20 != uVar18);
    }
    else {
      uVar18 = 0;
      do {
        *(BCLine *)((long)o + uVar18 * 4 + uVar25 + lVar17 + uVar16) =
             pBVar15[uVar18 + 1].line - iVar19;
        uVar18 = uVar18 + 1;
      } while (uVar20 != uVar18);
    }
    __dest = (void *)(lVar30 + (long)o);
    iVar19 = *(int *)&(ls->sb).w;
    pcVar29 = (ls->sb).b;
    *(void **)&(o->th).stacksize = __dest;
    (o->th).exdata = (void *)((ulong)(uint)((int)__dest_00 - (int)pcVar21) + (long)__dest);
    memcpy(__dest,pcVar29,(ulong)(uint)(iVar19 - (int)pcVar29));
    if (((*(byte *)((L->glref).ptr64 + 0x93) & 1) != 0) &&
       (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_BC), argbase != 0)) {
      pTVar27 = L->top;
      L->top = pTVar27 + 1;
      pTVar27->u64 = (ulong)o | 0xfffc000000000000;
      lj_vmevent_call(L,argbase);
    }
    L->top = L->top + -1;
    ls->vtop = fs->vbase;
    ls->fs = fs->prev;
    return (GCproto *)o;
  }
  err_limit(fs,0x10000,"constants");
}

Assistant:

static GCproto *fs_finish(LexState *ls, BCLine line)
{
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  BCLine numline = line - fs->linedefined;
  size_t sizept, ofsk, ofsuv, ofsli, ofsdbg, ofsvar;
  GCproto *pt;

  /* Apply final fixups. */
  fs_fixup_ret(fs);

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = sizeof(GCproto) + fs->pc*sizeof(BCIns) + fs->nkgc*sizeof(GCRef);
  sizept = (sizept + sizeof(TValue)-1) & ~(sizeof(TValue)-1);
  ofsk = sizept; sizept += fs->nkn*sizeof(TValue);
  ofsuv = sizept; sizept += ((fs->nuv+1)&~1)*2;
  ofsli = sizept; sizept += fs_prep_line(fs, numline);
  ofsdbg = sizept; sizept += fs_prep_var(ls, fs, &ofsvar);

  /* Allocate prototype and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->sizept = (MSize)sizept;
  pt->trace = 0;
  pt->flags = (uint8_t)(fs->flags & ~(PROTO_HAS_RETURN|PROTO_FIXUP_RETURN));
  pt->numparams = fs->numparams;
  pt->framesize = fs->framesize;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(fs->nkgc+1)) = 0;
  fs_fixup_bc(fs, pt, (BCIns *)((char *)pt + sizeof(GCproto)), fs->pc);
  fs_fixup_k(fs, pt, (void *)((char *)pt + ofsk));
  fs_fixup_uv1(fs, pt, (uint16_t *)((char *)pt + ofsuv));
  fs_fixup_line(fs, pt, (void *)((char *)pt + ofsli), numline);
  fs_fixup_var(ls, pt, (uint8_t *)((char *)pt + ofsdbg), ofsvar);

  lj_vmevent_send(L, BC,
    setprotoV(L, L->top++, pt);
  );

  L->top--;  /* Pop table of constants. */
  ls->vtop = fs->vbase;  /* Reset variable stack. */
  ls->fs = fs->prev;
  lj_assertL(ls->fs != NULL || ls->tok == TK_eof, "bad parser state");
  return pt;
}